

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::Test::RecordProperty(string *key,int value)

{
  string local_70;
  string local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  allocator<char> local_21;
  
  Message::Message((Message *)&local_30);
  std::ostream::operator<<(&(local_30._M_head_impl)->field_0x10,value);
  internal::StringStreamToString(&local_50,local_30._M_head_impl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,local_50._M_dataplus._M_p,&local_21);
  RecordProperty(key,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Test::RecordProperty(const std::string& key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}